

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O0

void sign_verify_generic_invoker(void)

{
  undefined1 auVar1 [64];
  basic_wrap_stringstream<char> *file;
  basic_wrap_stringstream<char> *line_num;
  basic_wrap_stringstream<char> *msg;
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  undefined1 auVar2 [64];
  sign_verify_generic *in_stack_000003f0;
  sign_verify_generic t;
  char (*in_stack_fffffffffffff618) [20];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff620;
  std_string *in_stack_fffffffffffff628;
  basic_cstring<const_char> *in_stack_fffffffffffff630;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff640;
  basic_wrap_stringstream<char> *this_01;
  const_string *in_stack_fffffffffffff658;
  size_t in_stack_fffffffffffff660;
  const_string *in_stack_fffffffffffff668;
  unit_test_log_t *in_stack_fffffffffffff670;
  unit_test_log_t *this_02;
  undefined1 local_8c8 [64];
  undefined1 local_888 [64];
  undefined1 local_848 [64];
  undefined1 local_808 [64];
  undefined1 local_7c8 [64];
  undefined1 auStack_788 [24];
  undefined1 local_770 [40];
  undefined1 auStack_748 [24];
  basic_cstring<const_char> local_720;
  undefined1 local_709;
  undefined1 local_708 [64];
  undefined1 local_6c8 [64];
  undefined1 local_688 [64];
  undefined1 local_648 [64];
  undefined1 local_608 [64];
  undefined1 auStack_5c8 [24];
  undefined1 local_5b0 [40];
  undefined1 auStack_588 [24];
  basic_cstring<const_char> local_560;
  undefined1 local_549;
  undefined1 local_548 [64];
  undefined1 local_508 [64];
  undefined1 local_4c8 [64];
  undefined1 local_488 [64];
  undefined1 local_448 [64];
  undefined1 auStack_408 [24];
  undefined1 local_3f0 [40];
  undefined1 auStack_3c8 [24];
  basic_cstring<const_char> local_3a0;
  undefined1 local_389;
  undefined1 local_388 [64];
  undefined1 local_348 [64];
  undefined1 local_308 [64];
  undefined1 local_2c8 [64];
  undefined1 local_288 [64];
  undefined1 auStack_248 [24];
  undefined1 local_230 [40];
  undefined1 auStack_208 [24];
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c5;
  undefined1 local_1b8 [64];
  undefined1 local_178 [64];
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [64];
  undefined1 auStack_78 [24];
  undefined1 local_60 [40];
  undefined1 auStack_38 [24];
  basic_cstring<const_char> local_10;
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
             ,0x5b);
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_38 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_78 = auVar1._0_24_;
  local_60 = auVar1._24_40_;
  local_b8 = vmovdqu64_avx512f(auVar2);
  local_f8 = vmovdqu64_avx512f(auVar2);
  local_138 = vmovdqu64_avx512f(auVar2);
  local_178 = vmovdqu64_avx512f(auVar2);
  local_1b8 = vmovdqu64_avx512f(auVar2);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_1b8);
  local_1c5 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             in_stack_fffffffffffff658);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
             ,0x5b);
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_208 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_248 = auVar1._0_24_;
  local_230 = auVar1._24_40_;
  local_288 = vmovdqu64_avx512f(auVar2);
  local_2c8 = vmovdqu64_avx512f(auVar2);
  local_308 = vmovdqu64_avx512f(auVar2);
  local_348 = vmovdqu64_avx512f(auVar2);
  local_388 = vmovdqu64_avx512f(auVar2);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_388);
  local_389 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [16])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             in_stack_fffffffffffff658);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::setup_conditional<sign_verify_generic>
            ((sign_verify_generic *)in_stack_fffffffffffff620);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3a0,
             "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
             ,0x5b);
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_3c8 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_408 = auVar1._0_24_;
  local_3f0 = auVar1._24_40_;
  local_448 = vmovdqu64_avx512f(auVar2);
  local_488 = vmovdqu64_avx512f(auVar2);
  local_4c8 = vmovdqu64_avx512f(auVar2);
  local_508 = vmovdqu64_avx512f(auVar2);
  local_548 = vmovdqu64_avx512f(auVar2);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_548);
  local_549 = 0x22;
  boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  boost::operator<<(in_stack_fffffffffffff620,(char (*) [13])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffff670,in_stack_fffffffffffff668,in_stack_fffffffffffff660,
             in_stack_fffffffffffff658);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  sign_verify_generic::test_method(in_stack_000003f0);
  this_02 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_560,
             "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
             ,0x5b);
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_588 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_5c8 = auVar1._0_24_;
  local_5b0 = auVar1._24_40_;
  local_608 = vmovdqu64_avx512f(auVar2);
  local_648 = vmovdqu64_avx512f(auVar2);
  local_688 = vmovdqu64_avx512f(auVar2);
  local_6c8 = vmovdqu64_avx512f(auVar2);
  local_708 = vmovdqu64_avx512f(auVar2);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_708);
  local_709 = 0x22;
  file = boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  line_num = boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  msg = boost::operator<<(in_stack_fffffffffffff620,(char (*) [19])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff640);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff630,in_stack_fffffffffffff628);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_02,(const_string *)file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::unit_test::teardown_conditional<sign_verify_generic>
            ((sign_verify_generic *)in_stack_fffffffffffff620);
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_720,
             "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
             ,0x5b);
  auVar2 = ZEXT1664((undefined1  [16])0x0);
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_748 = auVar1._40_24_;
  auVar1 = vmovdqu64_avx512f(auVar2);
  auStack_788 = auVar1._0_24_;
  local_770 = auVar1._24_40_;
  local_7c8 = vmovdqu64_avx512f(auVar2);
  local_808 = vmovdqu64_avx512f(auVar2);
  local_848 = vmovdqu64_avx512f(auVar2);
  local_888 = vmovdqu64_avx512f(auVar2);
  local_8c8 = vmovdqu64_avx512f(auVar2);
  this_01 = (basic_wrap_stringstream<char> *)local_8c8;
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff620);
  boost::basic_wrap_stringstream<char>::ref(this_01);
  this = boost::operator<<(in_stack_fffffffffffff620,*in_stack_fffffffffffff618);
  s = boost::operator<<(in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  this_00 = boost::operator<<(in_stack_fffffffffffff620,(char (*) [15])in_stack_fffffffffffff618);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(this_01);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (this_02,(const_string *)file,(size_t)line_num,(const_string *)msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify_generic) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  // Serialize key pair
  std::vector<uint8_t> serialized_private_key;
  serialized_private_key.resize(PICNIC_CONCAT(PARAM, get_private_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_private_key)(&private_key, serialized_private_key.data(),
                                                     serialized_private_key.size()) ==
             serialized_private_key.size());

  std::vector<uint8_t> serialized_public_key;
  serialized_public_key.resize(PICNIC_CONCAT(PARAM, get_public_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_public_key)(&public_key, serialized_public_key.data(),
                                                    serialized_public_key.size()) ==
             serialized_public_key.size());

  // Deserialize key pair
  picnic_privatekey_t gen_private_key;
  picnic_publickey_t gen_public_key;
  BOOST_TEST(!picnic_read_private_key(&gen_private_key, serialized_private_key.data(),
                                      serialized_private_key.size()));
  BOOST_TEST(!picnic_read_public_key(&gen_public_key, serialized_public_key.data(),
                                     serialized_public_key.size()));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));

  siglen = max_signature_size;
  // Sign another message
  BOOST_TEST(!picnic_sign(&gen_private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));
}